

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_classes.cc
# Opt level: O3

void add_samples(teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
                 *teacher)

{
  double *pdVar1;
  sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> *desired_00;
  long lVar2;
  double (*__first) [3];
  vector<double,_std::allocator<double>_> desired;
  vector<double,_std::allocator<double>_> input;
  void *local_90 [2];
  long local_80;
  void *local_78 [2];
  long local_68;
  sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_> local_60;
  
  __first = learning_samples;
  lVar2 = 3;
  do {
    pdVar1 = *__first;
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)local_78,*__first,pdVar1 + 2,
               (allocator_type *)&local_60);
    __first = __first + 1;
    desired_00 = &local_60;
    std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)local_90,pdVar1 + 2,*__first,
               (allocator_type *)&local_60);
    klogic::transform::
    continuous<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,std::vector<double,std::allocator<double>>>
              (&local_60,(transform *)local_78,(vector<double,_std::allocator<double>_> *)local_90,
               (vector<double,_std::allocator<double>_> *)desired_00);
    std::
    vector<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
    ::push_back(&teacher->_samples,&local_60);
    if (local_60.desired.
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.desired.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.desired.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.desired.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_60.input.
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.input.
                      super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_60.input.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.input.
                            super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90[0] != (void *)0x0) {
      operator_delete(local_90[0],local_80 - (long)local_90[0]);
    }
    if (local_78[0] != (void *)0x0) {
      operator_delete(local_78[0],local_68 - (long)local_78[0]);
    }
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return;
}

Assistant:

void add_samples(learning::teacher<mlmvn> &teacher) 
{
    for (int i = 0; i < nsamples; ++i) {
        const double *inp_beg = &learning_samples[i][0], *inp_end = inp_beg + 2;
        vector<double> input(inp_beg, inp_end);
        vector<double> desired(inp_beg + 2, inp_beg + 3);

        teacher.add_sample(transform::continuous<cvector>(input, desired));
    }
}